

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O1

void output_and_account_confidence_example(vw *all,example *ec)

{
  float fVar1;
  double dVar2;
  int *piVar3;
  ulong uVar4;
  
  shared_data::update(all->sd,ec->test_only,(bool)(-((ec->l).simple.label != 3.4028235e+38) & 1),
                      ec->loss,ec->weight,ec->num_features);
  fVar1 = (ec->l).simple.label;
  if (((fVar1 != 3.4028235e+38) || (NAN(fVar1))) && (ec->test_only == false)) {
    all->sd->weighted_labels = (double)(fVar1 * ec->weight) + all->sd->weighted_labels;
  }
  fVar1 = (ec->l).simple.label;
  dVar2 = 0.0;
  if ((fVar1 == 3.4028235e+38) && (dVar2 = 0.0, !NAN(fVar1))) {
    dVar2 = (double)ec->weight;
  }
  all->sd->weighted_unlabeled_examples = dVar2 + all->sd->weighted_unlabeled_examples;
  (*all->print)(all->raw_prediction,ec->partial_prediction,-1.0,ec->tag);
  piVar3 = (all->final_prediction_sink)._begin;
  if ((all->final_prediction_sink)._end != piVar3) {
    uVar4 = 0;
    do {
      confidence_print_result(piVar3[uVar4],(ec->pred).scalar,ec->confidence,ec->tag);
      uVar4 = uVar4 + 1;
      piVar3 = (all->final_prediction_sink)._begin;
    } while (uVar4 < (ulong)((long)(all->final_prediction_sink)._end - (long)piVar3 >> 2));
  }
  print_update(all,ec);
  return;
}

Assistant:

void output_and_account_confidence_example(vw& all, example& ec)
{
  label_data& ld = ec.l.simple;

  all.sd->update(ec.test_only, ld.label != FLT_MAX, ec.loss, ec.weight, ec.num_features);
  if (ld.label != FLT_MAX && !ec.test_only)
    all.sd->weighted_labels += ld.label * ec.weight;
  all.sd->weighted_unlabeled_examples += ld.label == FLT_MAX ? ec.weight : 0;

  all.print(all.raw_prediction, ec.partial_prediction, -1, ec.tag);
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = (int)all.final_prediction_sink[i];
    confidence_print_result(f, ec.pred.scalar, ec.confidence, ec.tag);
  }

  print_update(all, ec);
}